

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_p1363_test.cc
# Opt level: O0

void __thiscall
ECDSAP1363Test_SignSucceedsWithLargeBuffer_Test::TestBody
          (ECDSAP1363Test_SignSucceedsWithLargeBuffer_Test *this)

{
  bool bVar1;
  char *pcVar2;
  pointer peVar3;
  EC_GROUP *group;
  size_type sVar4;
  uchar *puVar5;
  reference lhs;
  pointer eckey;
  char *in_R9;
  string local_290;
  AssertHelper local_270;
  Message local_268;
  int local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar__5;
  Message local_240;
  char local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_2;
  Message local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1e0;
  Message local_1d8;
  int local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__4;
  size_t out_sig_len;
  undefined1 local_1a8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  Message local_188;
  uint local_17c;
  undefined1 local_178 [8];
  AssertionResult gtest_ar;
  size_t sig_len;
  AssertHelper local_140;
  Message local_138;
  int local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_f8;
  Message local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_b0;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<EC_KEY> key;
  string local_80;
  AssertHelper local_60;
  Message local_58 [3];
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  uint8_t digest [20];
  ECDSAP1363Test_SignSucceedsWithLargeBuffer_Test *this_local;
  
  local_3c = RAND_bytes((uchar *)&gtest_ar_.message_,0x14);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_38,&local_3c,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)local_38,
               (AssertionResult *)"RAND_bytes(digest, sizeof(digest))","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
               ,0xa8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (bVar1) {
    peVar3 = (pointer)EC_KEY_new();
    std::unique_ptr<ec_key_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ec_key_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,peVar3);
    testing::AssertionResult::AssertionResult<std::unique_ptr<ec_key_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_a0,
               (unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_a0,(AssertionResult *)0x8f28b1,
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                 ,0xab,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    if (bVar1) {
      peVar3 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      group = EC_group_p256();
      local_e4 = EC_KEY_set_group((EC_KEY *)peVar3,(EC_GROUP *)group);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_e0,&local_e4,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
      if (!bVar1) {
        testing::Message::Message(&local_f0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_e0,
                   (AssertionResult *)"EC_KEY_set_group(key.get(), EC_group_p256())","false","true",
                   in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                   ,0xac,pcVar2);
        testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
      if (bVar1) {
        peVar3 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_)
        ;
        local_12c = EC_KEY_generate_key((EC_KEY *)peVar3);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_128,&local_12c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
        if (!bVar1) {
          testing::Message::Message(&local_138);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&sig_len,(internal *)local_128,
                     (AssertionResult *)"EC_KEY_generate_key(key.get())","false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                     ,0xad,pcVar2);
          testing::internal::AssertHelper::operator=(&local_140,&local_138);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          std::__cxx11::string::~string((string *)&sig_len);
          testing::Message::~Message(&local_138);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
        if (bVar1) {
          peVar3 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                              &gtest_ar__1.message_);
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )ECDSA_size_p1363(peVar3);
          local_17c = 0;
          testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
                    ((internal *)local_178,"sig_len","0u",(unsigned_long *)&gtest_ar.message_,
                     &local_17c);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
          if (!bVar1) {
            testing::Message::Message(&local_188);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)
                       &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                       ,0xb0,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)
                       &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,&local_188);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)
                       &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            testing::Message::~Message(&local_188);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
          if (bVar1) {
            sVar4 = (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1;
            out_sig_len._7_1_ = 0x78;
            std::allocator<unsigned_char>::allocator
                      ((allocator<unsigned_char> *)((long)&out_sig_len + 6));
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,sVar4,
                       (value_type_conflict1 *)((long)&out_sig_len + 7),
                       (allocator<unsigned_char> *)((long)&out_sig_len + 6));
            std::allocator<unsigned_char>::~allocator
                      ((allocator<unsigned_char> *)((long)&out_sig_len + 6));
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
            sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
            peVar3 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                &gtest_ar__1.message_);
            local_1cc = ECDSA_sign_p1363((uint8_t *)&gtest_ar_.message_,0x14,puVar5,
                                         (size_t *)&gtest_ar__4.message_,sVar4,peVar3);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1c8,&local_1cc,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
            if (!bVar1) {
              testing::Message::Message(&local_1d8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_1.message_,(internal *)local_1c8,
                         (AssertionResult *)
                         "ECDSA_sign_p1363(digest, sizeof(digest), sig.data(), &out_sig_len, sig.size(), key.get())"
                         ,"false","true",(char *)peVar3);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1e0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                         ,0xb5,pcVar2);
              testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
              testing::internal::AssertHelper::~AssertHelper(&local_1e0);
              std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
              testing::Message::~Message(&local_1d8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
            if (bVar1) {
              testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                        ((EqHelper *)local_210,"out_sig_len","sig_len",
                         (unsigned_long *)&gtest_ar__4.message_,(unsigned_long *)&gtest_ar.message_)
              ;
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
              if (!bVar1) {
                testing::Message::Message(&local_218);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                           ,0xb6,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_2.message_,&local_218);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_)
                ;
                testing::Message::~Message(&local_218);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
              if (bVar1) {
                lhs = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8)
                ;
                local_231 = 'x';
                testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
                          ((EqHelper *)local_230,"sig.back()","\'x\'",lhs,&local_231);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_230);
                if (!bVar1) {
                  testing::Message::Message(&local_240);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                             ,0xb8,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__5.message_,&local_240);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__5.message_);
                  testing::Message::~Message(&local_240);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
                puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_1a8);
                eckey = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                  ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__1.message_);
                local_25c = ECDSA_verify_p1363((uint8_t *)&gtest_ar_.message_,0x14,puVar5,
                                               (size_t)gtest_ar__4.message_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,eckey);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_258,&local_25c,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_258);
                if (!bVar1) {
                  testing::Message::Message(&local_268);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_290,(internal *)local_258,
                             (AssertionResult *)
                             "ECDSA_verify_p1363(digest, sizeof(digest), sig.data(), out_sig_len, key.get())"
                             ,"false","true",(char *)peVar3);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_270,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_p1363_test.cc"
                             ,0xbb,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_270,&local_268);
                  testing::internal::AssertHelper::~AssertHelper(&local_270);
                  std::__cxx11::string::~string((string *)&local_290);
                  testing::Message::~Message(&local_268);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
              }
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
          }
        }
      }
    }
    std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  return;
}

Assistant:

TEST(ECDSAP1363Test, SignSucceedsWithLargeBuffer) {
  // Fill digest values with some random data.
  uint8_t digest[20];
  ASSERT_TRUE(RAND_bytes(digest, sizeof(digest)));

  bssl::UniquePtr<EC_KEY> key(EC_KEY_new());
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_set_group(key.get(), EC_group_p256()));
  ASSERT_TRUE(EC_KEY_generate_key(key.get()));

  size_t sig_len = ECDSA_size_p1363(key.get());
  ASSERT_GT(sig_len, 0u);
  std::vector<uint8_t> sig(sig_len + 1, 'x');

  size_t out_sig_len;
  ASSERT_TRUE(ECDSA_sign_p1363(digest, sizeof(digest), sig.data(),
                                &out_sig_len, sig.size(), key.get()));
  ASSERT_EQ(out_sig_len, sig_len);
  // The extra byte should be untouched.
  EXPECT_EQ(sig.back(), 'x');

  ASSERT_TRUE(ECDSA_verify_p1363(digest, sizeof(digest), sig.data(),
                                 out_sig_len, key.get()));
}